

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# zstd.c
# Opt level: O1

ZSTDMT_CCtx * ZSTDMT_createCCtx_advanced(uint nbWorkers,ZSTD_customMem cMem,ZSTD_threadPool *pool)

{
  int iVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  ZSTDMT_CCtx *mtctx;
  POOL_ctx *pPVar5;
  ZSTDMT_jobDescription *pZVar6;
  ZSTDMT_bufferPool *pZVar7;
  ZSTDMT_CCtxPool *pZVar8;
  pthread_mutex_t *__mutex;
  undefined4 extraout_EDX;
  int iVar9;
  char *__assertion;
  uint maxNbBuffers;
  undefined1 auVar10 [16];
  undefined1 auVar11 [16];
  uint local_2c;
  
  local_2c = nbWorkers + 2;
  if (nbWorkers != 0) {
    maxNbBuffers = 0x100;
    if (nbWorkers < 0x100) {
      maxNbBuffers = nbWorkers;
    }
    if ((cMem.customFree != (ZSTD_freeFunction)0x0) == (cMem.customAlloc != (ZSTD_allocFunction)0x0)
       ) {
      if (cMem.customAlloc == (ZSTD_allocFunction)0x0) {
        mtctx = (ZSTDMT_CCtx *)calloc(1,0xc10);
      }
      else {
        mtctx = (ZSTDMT_CCtx *)(*cMem.customAlloc)(cMem.opaque,0xc10);
        memset(mtctx,0,0xc10);
      }
      if (mtctx != (ZSTDMT_CCtx *)0x0) {
        (mtctx->params).nbWorkers = maxNbBuffers;
        (mtctx->cMem).customAlloc = cMem.customAlloc;
        (mtctx->cMem).customFree = cMem.customFree;
        (mtctx->cMem).opaque = cMem.opaque;
        mtctx->allJobsCompleted = 1;
        if (pool == (ZSTD_threadPool *)0x0) {
          pPVar5 = POOL_create_advanced((ulong)maxNbBuffers,0,cMem);
          mtctx->factory = pPVar5;
          mtctx->field_0xc08 = mtctx->field_0xc08 & 0xfe;
        }
        else {
          mtctx->factory = pool;
          mtctx->field_0xc08 = mtctx->field_0xc08 | 1;
        }
        pZVar6 = ZSTDMT_createJobsTable(&local_2c,cMem);
        mtctx->jobs = pZVar6;
        if (local_2c == 0) {
          __assertion = "nbJobs > 0";
        }
        else {
          if ((local_2c & local_2c - 1) == 0) {
            mtctx->jobIDMask = local_2c - 1;
            pZVar7 = ZSTDMT_createBufferPool(maxNbBuffers * 2 + 3,cMem);
            mtctx->bufPool = pZVar7;
            pZVar8 = ZSTDMT_createCCtxPool(maxNbBuffers,cMem);
            mtctx->cctxPool = pZVar8;
            __mutex = (pthread_mutex_t *)ZSTDMT_createBufferPool(maxNbBuffers,cMem);
            if (__mutex == (pthread_mutex_t *)0x0) {
              __mutex = (pthread_mutex_t *)0x0;
            }
            else {
              pthread_mutex_lock(__mutex);
              __mutex[1].__align = 0;
              pthread_mutex_unlock(__mutex);
            }
            mtctx->seqPool = (ZSTDMT_seqPool *)__mutex;
            memset(&mtctx->serial,0,0xa48);
            iVar1 = pthread_mutex_init((pthread_mutex_t *)&mtctx->serial,(pthread_mutexattr_t *)0x0)
            ;
            iVar2 = pthread_cond_init((pthread_cond_t *)&(mtctx->serial).cond,
                                      (pthread_condattr_t *)0x0);
            iVar3 = pthread_mutex_init((pthread_mutex_t *)&(mtctx->serial).ldmWindowMutex,
                                       (pthread_mutexattr_t *)0x0);
            iVar4 = pthread_cond_init((pthread_cond_t *)&(mtctx->serial).ldmWindowCond,
                                      (pthread_condattr_t *)0x0);
            (mtctx->roundBuff).buffer = (BYTE *)0x0;
            (mtctx->roundBuff).capacity = 0;
            (mtctx->roundBuff).pos = 0;
            auVar11._0_8_ = -(ulong)(mtctx->bufPool == (ZSTDMT_bufferPool *)0x0);
            auVar11._8_8_ = -(ulong)(mtctx->cctxPool == (ZSTDMT_CCtxPool *)0x0);
            auVar10._0_8_ = -(ulong)(mtctx->factory == (POOL_ctx *)0x0);
            auVar10._8_8_ = -(ulong)(mtctx->jobs == (ZSTDMT_jobDescription *)0x0);
            auVar10 = packssdw(auVar10,auVar11);
            iVar9 = movmskps(extraout_EDX,auVar10);
            if ((iVar9 != 0 || mtctx->seqPool == (ZSTDMT_seqPool *)0x0) ||
                ((iVar4 != 0 || iVar3 != 0) || (iVar2 != 0 || iVar1 != 0))) {
              ZSTDMT_freeCCtx(mtctx);
              return (ZSTDMT_CCtx *)0x0;
            }
            return mtctx;
          }
          __assertion = "(nbJobs & (nbJobs - 1)) == 0";
        }
        __assert_fail(__assertion,
                      "/workspace/llm4binary/github/license_c_cmakelists/KhronosGroup[P]KTX-Software/external/basisu/zstd/zstd.c"
                      ,0x8899,
                      "ZSTDMT_CCtx *ZSTDMT_createCCtx_advanced_internal(unsigned int, ZSTD_customMem, ZSTD_threadPool *)"
                     );
      }
    }
  }
  return (ZSTDMT_CCtx *)0x0;
}

Assistant:

ZSTDMT_CCtx* ZSTDMT_createCCtx_advanced(unsigned nbWorkers, ZSTD_customMem cMem, ZSTD_threadPool* pool)
{
#ifdef ZSTD_MULTITHREAD
    return ZSTDMT_createCCtx_advanced_internal(nbWorkers, cMem, pool);
#else
    (void)nbWorkers;
    (void)cMem;
    (void)pool;
    return NULL;
#endif
}